

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetPrototypeForLazyMessage
          (ExtensionSet *this,MessageLite *extendee,int number)

{
  bool bVar1;
  undefined1 local_68 [8];
  ExtensionInfo extension_info;
  bool was_packed_on_wire;
  GeneratedExtensionFinder finder;
  int number_local;
  MessageLite *extendee_local;
  ExtensionSet *this_local;
  
  finder.extendee_._4_4_ = number;
  GeneratedExtensionFinder::GeneratedExtensionFinder
            ((GeneratedExtensionFinder *)&stack0xffffffffffffffd0,extendee);
  extension_info.lazy_eager_verify_func._7_1_ = 0;
  ExtensionInfo::ExtensionInfo((ExtensionInfo *)local_68);
  bVar1 = FindExtensionInfoFromFieldNumber<google::protobuf::internal::GeneratedExtensionFinder>
                    (this,2,finder.extendee_._4_4_,
                     (GeneratedExtensionFinder *)&stack0xffffffffffffffd0,(ExtensionInfo *)local_68,
                     (bool *)((long)&extension_info.lazy_eager_verify_func + 7));
  if (bVar1) {
    this_local = (ExtensionSet *)extension_info._8_8_;
  }
  else {
    this_local = (ExtensionSet *)0x0;
  }
  return (MessageLite *)this_local;
}

Assistant:

const MessageLite* ExtensionSet::GetPrototypeForLazyMessage(
    const MessageLite* extendee, int number) const {
  GeneratedExtensionFinder finder(extendee);
  bool was_packed_on_wire = false;
  ExtensionInfo extension_info;
  if (!FindExtensionInfoFromFieldNumber(
          WireFormatLite::WireType::WIRETYPE_LENGTH_DELIMITED, number, &finder,
          &extension_info, &was_packed_on_wire)) {
    return nullptr;
  }
  return extension_info.message_info.prototype;
}